

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetGlobals.cpp
# Opt level: O0

void __thiscall wasm::SetGlobals::run(SetGlobals *this,Module *module)

{
  char *this_00;
  bool bVar1;
  int init;
  reference input_00;
  reference pvVar2;
  Fatal *pFVar3;
  longlong init_00;
  Const *pCVar4;
  Name *pNVar5;
  Name local_568;
  Literal local_558;
  Builder local_540;
  Fatal local_538;
  Literal local_3b0;
  BasicType local_394;
  Literal local_390;
  BasicType local_374;
  undefined1 local_370 [8];
  Literal lit;
  string_view local_1d0;
  Global *local_1c0;
  Global *glob;
  value_type value;
  value_type name;
  string local_170;
  undefined1 local_150 [8];
  Split nameAndValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pair;
  iterator __end2;
  iterator __begin2;
  Split *__range2;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  Split pairs;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  Name input;
  Module *module_local;
  SetGlobals *this_local;
  
  input.super_IString.str._M_str = (char *)module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"set-globals",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w",
             (allocator<char> *)&pairs.field_0x1f);
  Pass::getArgument(&local_48,&this->super_Pass,&local_68,&local_a0);
  wasm::Name::Name((Name *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&pairs.field_0x1f);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  IString::toString_abi_cxx11_(&local_e8,(IString *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,",",(allocator<char> *)((long)&__range2 + 7));
  String::Split::Split((Split *)local_c8,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&local_e8);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c8);
  pair = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&pair);
    if (!bVar1) {
      String::Split::~Split((Split *)local_c8);
      return;
    }
    input_00 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    nameAndValue._24_8_ = input_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"=",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
    String::Split::Split((Split *)local_150,input_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_150,0);
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8),(string *)pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_150,1);
    std::__cxx11::string::string((string *)&glob,(string *)pvVar2);
    this_00 = input.super_IString.str._M_str;
    wasm::Name::Name((Name *)&local_1d0,(string *)((long)&value.field_2 + 8));
    local_1c0 = Module::getGlobalOrNull((Module *)this_00,(Name)local_1d0);
    if (local_1c0 == (Global *)0x0) break;
    wasm::Literal::Literal((Literal *)local_370);
    local_374 = i32;
    bVar1 = wasm::Type::operator==(&local_1c0->type,&local_374);
    if (bVar1) {
      init = std::__cxx11::stoi((string *)&glob,(size_t *)0x0,10);
      wasm::Literal::Literal(&local_390,init);
      wasm::Literal::operator=((Literal *)local_370,&local_390);
      wasm::Literal::~Literal(&local_390);
    }
    else {
      local_394 = i64;
      bVar1 = wasm::Type::operator==(&local_1c0->type,&local_394);
      if (!bVar1) {
        Fatal::Fatal(&local_538);
        pFVar3 = Fatal::operator<<(&local_538,(char (*) [33])"global\'s type is not supported: ");
        Fatal::operator<<(pFVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&value.field_2 + 8));
        Fatal::~Fatal(&local_538);
      }
      init_00 = std::__cxx11::stoll((string *)&glob,(size_t *)0x0,10);
      wasm::Literal::Literal(&local_3b0,init_00);
      wasm::Literal::operator=((Literal *)local_370,&local_3b0);
      wasm::Literal::~Literal(&local_3b0);
    }
    Builder::Builder(&local_540,(Module *)input.super_IString.str._M_str);
    wasm::Literal::Literal(&local_558,(Literal *)local_370);
    pCVar4 = Builder::makeConst(&local_540,&local_558);
    local_1c0->init = (Expression *)pCVar4;
    wasm::Literal::~Literal(&local_558);
    wasm::Name::Name(&local_568);
    pNVar5 = wasm::Name::operator=(&(local_1c0->super_Importable).base,&local_568);
    wasm::Name::operator=(&(local_1c0->super_Importable).module,pNVar5);
    wasm::Literal::~Literal((Literal *)local_370);
    std::__cxx11::string::~string((string *)&glob);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    String::Split::~Split((Split *)local_150);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  Fatal::Fatal((Fatal *)&lit.type);
  pFVar3 = Fatal::operator<<((Fatal *)&lit.type,(char (*) [24])"Could not find global: ");
  Fatal::operator<<(pFVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&value.field_2 + 8));
  Fatal::~Fatal((Fatal *)&lit.type);
}

Assistant:

void run(Module* module) override {
    Name input =
      getArgument("set-globals",
                  "SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w");

    // The input is a set of X=Y pairs separated by commas.
    String::Split pairs(input.toString(), ",");
    for (auto& pair : pairs) {
      String::Split nameAndValue(pair, "=");
      auto name = nameAndValue[0];
      auto value = nameAndValue[1];
      auto* glob = module->getGlobalOrNull(name);
      if (!glob) {
        Fatal() << "Could not find global: " << name;
      }
      // Parse the input.
      Literal lit;
      if (glob->type == Type::i32) {
        lit = Literal(int32_t(stoi(value)));
      } else if (glob->type == Type::i64) {
        lit = Literal(int64_t(stoll(value)));
      } else {
        Fatal() << "global's type is not supported: " << name;
      }
      // The global now has a value, and is not imported.
      glob->init = Builder(*module).makeConst(lit);
      glob->module = glob->base = Name();
    }
  }